

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __thiscall
async_simple::coro::detail::
LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::awaitResume
          (LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
           *this)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000L>_> dVar2;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *ppVar3;
  undefined8 unaff_RBP;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> pVar4;
  
  ppVar3 = LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>::
           result((LazyPromise<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                   *)((long)(this->_handle).__handle_ + 0x10));
  bVar1 = ppVar3->first;
  dVar2.__r = (ppVar3->second).__r;
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  pVar4._0_8_ = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar1) & 0xffffffff;
  pVar4.second.__r = dVar2.__r;
  return pVar4;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }